

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int cmcmd::ExecuteLinkScript
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  cmUVProcessChainBuilder *this;
  Status *this_00;
  pointer pbVar5;
  int iVar6;
  string_view str;
  string_view value;
  cmUVProcessChain chain;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  string command;
  pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  exception;
  cmUVProcessChainBuilder builder;
  ifstream fin;
  size_t local_230;
  byte abStack_218 [488];
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x60 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5)) {
    str._M_str = pbVar5[3]._M_dataplus._M_p;
    str._M_len = pbVar5[3]._M_string_length;
    bVar1 = cmHasLiteralPrefix<11ul>(str,(char (*) [11])"--verbose=");
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&fin,(ulong)(pbVar5 + 3));
      value._M_str = (char *)_fin;
      value._M_len = local_230;
      bVar1 = cmValue::IsOff(value);
      std::__cxx11::string::~string((string *)&fin);
      bVar1 = !bVar1;
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00187ac8;
    }
  }
  bVar1 = false;
LAB_00187ac8:
  std::ifstream::ifstream(&fin,pbVar5[2]._M_dataplus._M_p,_S_in);
  if ((abStack_218[(long)_fin[-3]] & 5) == 0) {
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    iVar6 = 0;
    while (iVar6 == 0) {
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&fin,&command,(bool *)0x0,0xffffffffffffffff);
      if (!bVar2) break;
      iVar6 = 0;
      lVar4 = std::__cxx11::string::find_first_not_of((char *)&command,0x686ad8);
      if (lVar4 != -1) {
        cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
        this = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_OUTPUT,_stdout);
        cmUVProcessChainBuilder::SetExternalStream(this,Stream_ERROR,_stderr);
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        args2.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ParseUnixCommandLine(command._M_dataplus._M_p,&args2);
        cmUVProcessChainBuilder::AddCommand(&builder,&args2);
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,(string *)&command);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
        cmUVProcessChain::Wait(&chain,0);
        this_00 = cmUVProcessChain::GetStatus(&chain,0);
        cmUVProcessChain::Status::GetException_abi_cxx11_(&exception,this_00);
        if (exception.first == None) {
          iVar6 = (int)this_00->ExitStatus;
        }
        else if (exception.first == Spawn) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
          std::operator<<(poVar3,(string *)&exception.second);
          iVar6 = 2;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error running link command: ");
          std::operator<<(poVar3,(string *)&exception.second);
          iVar6 = 1;
        }
        std::__cxx11::string::~string((string *)&exception.second);
        cmUVProcessChain::~cmUVProcessChain(&chain);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&args2);
        cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
      }
    }
    std::__cxx11::string::~string((string *)&command);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error opening link script \"");
    poVar3 = std::operator<<(poVar3,(string *)
                                    ((args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 2));
    poVar3 = std::operator<<(poVar3,"\"");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar6 = 1;
  }
  std::ifstream::~ifstream(&fin);
  return iVar6;
}

Assistant:

int cmcmd::ExecuteLinkScript(std::vector<std::string> const& args)
{
  // The arguments are
  //   args[0] == <cmake-executable>
  //   args[1] == cmake_link_script
  //   args[2] == <link-script-name>
  //   args[3] == --verbose=?
  bool verbose = false;
  if (args.size() >= 4) {
    if (cmHasLiteralPrefix(args[3], "--verbose=")) {
      if (!cmIsOff(args[3].substr(10))) {
        verbose = true;
      }
    }
  }

  // Read command lines from the script.
  cmsys::ifstream fin(args[2].c_str());
  if (!fin) {
    std::cerr << "Error opening link script \"" << args[2] << "\""
              << std::endl;
    return 1;
  }

  // Run one command at a time.
  std::string command;
  int result = 0;
  while (result == 0 && cmSystemTools::GetLineFromStream(fin, command)) {
    // Skip empty command lines.
    if (command.find_first_not_of(" \t") == std::string::npos) {
      continue;
    }

    // Allocate a process instance.
    cmUVProcessChainBuilder builder;

    // Children should share stdout and stderr with this process.
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);

    // Setup this command line.
    std::vector<std::string> args2;
#ifdef _WIN32
    cmSystemTools::ParseWindowsCommandLine(command.c_str(), args2);
#else
    cmSystemTools::ParseUnixCommandLine(command.c_str(), args2);
#endif
    builder.AddCommand(args2);

    // Report the command if verbose output is enabled.
    if (verbose) {
      std::cout << command << std::endl;
    }

    // Run the command and wait for it to exit.
    auto chain = builder.Start();
    chain.Wait();

    // Report failure if any.
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        if (status.ExitStatus != 0) {
          result = static_cast<int>(status.ExitStatus);
        }
        break;
      case cmUVProcessChain::ExceptionCode::Spawn:
        std::cerr << "Error running link command: " << exception.second;
        result = 2;
        break;
      default:
        std::cerr << "Error running link command: " << exception.second;
        result = 1;
        break;
    }
  }

  // Return the final resulting return value.
  return result;
}